

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multikey_dynamic.cpp
# Opt level: O2

void multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_int>
               (uchar **strings,size_t N,size_t depth)

{
  uint uVar1;
  uint uVar2;
  uint32_t uVar3;
  size_t N_00;
  size_t N_01;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  uint j_1;
  ulong uVar7;
  uchar **t;
  size_t N_02;
  uint j;
  long lVar8;
  uchar **t_00;
  ulong uVar9;
  array<vector_block<unsigned_char_*,_1024U>,_3UL> buckets;
  array<unsigned_int,_32UL> cache;
  
  if (N < 10000) {
    mkqsort(strings,(int)N,(int)depth);
    return;
  }
  buckets._M_elems[0]._left_in_block = 0;
  buckets._M_elems[0]._index_block.
  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets._M_elems[0]._insertpos = (uchar **)0x0;
  buckets._M_elems[0]._index_block.
  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buckets._M_elems[0]._index_block.
  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets._M_elems[1]._index_block.
  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buckets._M_elems[1]._index_block.
  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets._M_elems[1]._index_block.
  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets._M_elems[1]._insertpos = (uchar **)0x0;
  buckets._M_elems[1]._left_in_block = 0;
  buckets._M_elems[2]._index_block.
  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  buckets._M_elems[2]._index_block.
  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  buckets._M_elems[2]._index_block.
  super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  buckets._M_elems[2]._insertpos = (uchar **)0x0;
  buckets._M_elems[2]._left_in_block = 0;
  uVar2 = pseudo_median<unsigned_int>(strings,N,depth);
  t = strings;
  for (uVar5 = 0; uVar5 < (N & 0xffffffffffffffe0); uVar5 = uVar5 + 0x20) {
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 1) {
      uVar3 = get_char<unsigned_int>(t[lVar8],depth);
      cache._M_elems[lVar8] = uVar3;
    }
    t_00 = t;
    for (lVar8 = 0; lVar8 != 0x20; lVar8 = lVar8 + 1) {
      uVar1 = cache._M_elems[lVar8];
      vector_block<unsigned_char_*,_1024U>::push_back
                (buckets._M_elems +
                 (ulong)(uVar1 == uVar2) + (ulong)(uVar2 <= uVar1 && uVar1 != uVar2) * 2,t_00);
      t_00 = t_00 + 1;
    }
    t = t + 0x20;
  }
  for (; uVar5 < N; uVar5 = uVar5 + 1) {
    uVar3 = get_char<unsigned_int>(*t,depth);
    vector_block<unsigned_char_*,_1024U>::push_back
              (buckets._M_elems +
               (ulong)(uVar3 == uVar2) + (ulong)(uVar2 <= uVar3 && uVar3 != uVar2) * 2,t);
    t = t + 1;
  }
  uVar5 = ((long)buckets._M_elems[0]._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)buckets._M_elems[0]._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_start) * 0x80;
  N_02 = uVar5 - buckets._M_elems[0]._left_in_block;
  uVar6 = ((long)buckets._M_elems[1]._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)buckets._M_elems[1]._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_start) * 0x80;
  uVar9 = (ulong)buckets._M_elems[1]._left_in_block;
  N_00 = uVar6 - uVar9;
  uVar7 = ((long)buckets._M_elems[2]._index_block.
                 super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                 super__Vector_impl_data._M_finish -
          (long)buckets._M_elems[2]._index_block.
                super__Vector_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                super__Vector_impl_data._M_start) * 0x80;
  uVar4 = (ulong)buckets._M_elems[2]._left_in_block;
  N_01 = uVar7 - uVar4;
  if (N_00 + N_02 + N_01 == N) {
    if (uVar5 != buckets._M_elems[0]._left_in_block) {
      copy<unsigned_char*,1024u,unsigned_char**>(buckets._M_elems,strings);
    }
    if (uVar6 != uVar9) {
      copy<unsigned_char*,1024u,unsigned_char**>(buckets._M_elems + 1,strings + N_02);
    }
    if (uVar7 != uVar4) {
      copy<unsigned_char*,1024u,unsigned_char**>(buckets._M_elems + 2,strings + N_02 + N_00);
    }
    vector_block<unsigned_char_*,_1024U>::clear(buckets._M_elems);
    vector_block<unsigned_char_*,_1024U>::clear(buckets._M_elems + 1);
    vector_block<unsigned_char_*,_1024U>::clear(buckets._M_elems + 2);
    multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_int>(strings,N_02,depth);
    if ((char)uVar2 != '\0') {
      multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_int>
                (strings + N_02,N_00,depth + 4);
    }
    multikey_dynamic<vector_block<unsigned_char*,1024u>,unsigned_int>
              (strings + N_02 + N_00,N_01,depth);
    std::array<vector_block<unsigned_char_*,_1024U>,_3UL>::~array(&buckets);
    return;
  }
  __assert_fail("bucketsize0 + bucketsize1 + bucketsize2 == N",
                "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/multikey_dynamic.cpp"
                ,0x5d,
                "void multikey_dynamic(unsigned char **, size_t, size_t) [BucketT = vector_block<unsigned char *>, CharT = unsigned int]"
               );
}

Assistant:

static void
multikey_dynamic(unsigned char** strings, size_t N, size_t depth)
{
	if (N < 10000) {
		mkqsort(strings, N, depth);
		return;
	}
	std::array<BucketT, 3> buckets;
	CharT partval = pseudo_median<CharT>(strings, N, depth);
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < N-N%32; i+=32) {
		std::array<CharT, 32> cache;
		for (unsigned j=0; j<32; ++j) {
			cache[j] = get_char<CharT>(strings[i+j], depth);
		}
		for (unsigned j=0; j<32; ++j) {
			const unsigned b = get_bucket(cache[j], partval);
			buckets[b].push_back(strings[i+j]);
		}
	}
	for (; i < N; ++i) {
		const CharT c = get_char<CharT>(strings[i], depth);
		const unsigned b = get_bucket(c, partval);
		buckets[b].push_back(strings[i]);
	}
	const size_t bucketsize0 = buckets[0].size();
	const size_t bucketsize1 = buckets[1].size();
	const size_t bucketsize2 = buckets[2].size();
	assert(bucketsize0 + bucketsize1 + bucketsize2 == N);
	if (bucketsize0) copy(buckets[0], strings);
	if (bucketsize1) copy(buckets[1], strings+bucketsize0);
	if (bucketsize2) copy(buckets[2], strings+bucketsize0+bucketsize1);
	clear_bucket(buckets[0]);
	clear_bucket(buckets[1]);
	clear_bucket(buckets[2]);
	multikey_dynamic<BucketT, CharT>(strings, bucketsize0, depth);
	if (not is_end(partval))
		multikey_dynamic<BucketT, CharT>(strings+bucketsize0,
				bucketsize1, depth+sizeof(CharT));
	multikey_dynamic<BucketT, CharT>(strings+bucketsize0+bucketsize1,
			bucketsize2, depth);
}